

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

ssize_t MaxQueuedMetadata(SstStream Stream)

{
  long lVar1;
  _TimestepMetadataMsg **pp_Var2;
  _TimestepMetadataList *p_Var3;
  long lVar4;
  
  p_Var3 = Stream->Timesteps;
  if (p_Var3 == (_TimestepMetadataList *)0x0) {
    CP_verbose(Stream,TraceVerbose,"MaxQueued Timestep returning -1\n");
    lVar4 = -1;
  }
  else {
    lVar4 = -1;
    do {
      pp_Var2 = &p_Var3->MetadataMsg;
      p_Var3 = p_Var3->Next;
      lVar1 = (*pp_Var2)->Timestep;
      if (lVar4 < lVar1) {
        lVar4 = lVar1;
      }
    } while (p_Var3 != (_TimestepMetadataList *)0x0);
    CP_verbose(Stream,TraceVerbose,"MaxQueued Timestep returning %zd\n",lVar4);
  }
  return lVar4;
}

Assistant:

static ssize_t MaxQueuedMetadata(SstStream Stream)
{
    struct _TimestepMetadataList *Next;
    ssize_t MaxTimestep = -1;
    STREAM_ASSERT_LOCKED(Stream);
    Next = Stream->Timesteps;
    if (Next == NULL)
    {
        CP_verbose(Stream, TraceVerbose, "MaxQueued Timestep returning -1\n");
        return -1;
    }
    while (Next)
    {
        if (Next->MetadataMsg->Timestep >= MaxTimestep)
        {
            MaxTimestep = Next->MetadataMsg->Timestep;
        }
        Next = Next->Next;
    }
    CP_verbose(Stream, TraceVerbose, "MaxQueued Timestep returning %zd\n", MaxTimestep);
    return MaxTimestep;
}